

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O0

void ExchCXX::lda_screening_interface<ExchCXX::BuiltinEPC18_2>::eval_exc_vxc_polar
               (double rho_a,double rho_b,double *eps,double *vrho_a,double *vrho_b)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  double x;
  double in_XMM1_Qa;
  double rho_s;
  double *in_stack_000001b0;
  double *in_stack_000001b8;
  double *in_stack_000001c0;
  double in_stack_000001c8;
  double in_stack_000001d0;
  double in_stack_ffffffffffffffc8;
  
  x = in_XMM0_Qa + in_XMM1_Qa;
  if (1e-24 < x) {
    safe_max<double>(x,in_stack_ffffffffffffffc8);
    safe_max<double>(x,in_stack_ffffffffffffffc8);
    kernel_traits<ExchCXX::BuiltinEPC18_2>::eval_exc_vxc_polar_impl
              (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
               in_stack_000001b0);
  }
  else {
    *in_RDI = 0;
    *in_RSI = 0;
    *in_RDX = 0;
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar( double rho_a, double rho_b, double& eps, double& vrho_a,
      double& vrho_b ) {

    const double rho_s = rho_a + rho_b;
    //const double rho_z = rho_a - rho_b;

    if( rho_s <= traits::dens_tol ) {
      eps    = 0.;
      vrho_a = 0.;
      vrho_b = 0.;
    } else {
      rho_a = safe_max(rho_a, traits::dens_tol);
      rho_b = safe_max(rho_b, traits::dens_tol);
      traits::eval_exc_vxc_polar_impl( rho_a, rho_b, eps, vrho_a, vrho_b );
    }

  }